

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  size_type sVar4;
  ostream *poVar5;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  int iVar7;
  allocator local_1c2;
  allocator local_1c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  key_type local_198;
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_178;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_128 [144];
  options_description desc;
  
  std::__cxx11::string::string((string *)&vm,"Allowed options",(allocator *)&filename);
  boost::program_options::options_description::options_description
            (&desc,(string *)&vm,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&vm);
  _vm = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&vm,"help,h");
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"output,o",(char *)ptVar2);
  ptVar2 = boost::program_options::value<std::__cxx11::string>();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,(value_semantic *)"namespace,n",(char *)ptVar2);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"input,i",(char *)ptVar3);
  boost::program_options::variables_map::variables_map(&vm);
  local_178.super_function_base.vtable = (vtable_base *)0x0;
  local_178.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_178.super_function_base.functor._8_8_ = 0;
  local_178.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)&filename,argc,argv,&desc,0,&local_178);
  boost::program_options::store((basic_parsed_options *)&filename,&vm,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&filename);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_178);
  boost::program_options::notify(&vm);
  std::__cxx11::string::string((string *)&filename,"help",&local_1c2);
  sVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::count(local_128,&filename);
  if (sVar4 == 0) {
    std::__cxx11::string::string((string *)&local_198,"input",&local_1c1);
    sVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
            ::count(local_128,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&filename);
    if (sVar4 != 0) {
      std::__cxx11::string::string((string *)&filename,"output",(allocator *)&local_198);
      sVar4 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
              ::count(local_128,&filename);
      std::__cxx11::string::~string((string *)&filename);
      if (sVar4 == 0) {
        iVar7 = 0;
        render_header((ostream *)&std::cout,&vm);
      }
      else {
        std::__cxx11::string::string((string *)&local_198,"output",&local_1c2);
        operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)&vm);
        pbVar6 = boost::any_cast<std::__cxx11::string_const&>(operand);
        std::__cxx11::string::string((string *)&filename,(string *)pbVar6);
        std::__cxx11::string::~string((string *)&local_198);
        local_158._8_8_ = 0;
        local_140 = std::
                    _Function_handler<void_(std::basic_fstream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/no1msd[P]headerize/src/main.cpp:100:42)>
                    ::_M_invoke;
        local_148 = std::
                    _Function_handler<void_(std::basic_fstream<char,_std::char_traits<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/no1msd[P]headerize/src/main.cpp:100:42)>
                    ::_M_manager;
        local_158._M_unused._0_8_ = (undefined8)(string *)&vm;
        open_file(&filename,_S_out,
                  (function<void_(std::basic_fstream<char,_std::char_traits<char>_>_&)> *)&local_158
                 );
        std::_Function_base::~_Function_base((_Function_base *)&local_158);
        std::__cxx11::string::~string((string *)&filename);
        iVar7 = 0;
      }
      goto LAB_0012e076;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&filename);
  }
  poVar5 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&desc);
  std::endl<char,std::char_traits<char>>(poVar5);
  iVar7 = 1;
LAB_0012e076:
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&desc);
  return iVar7;
}

Assistant:

int main(int argc, char* argv[]) {
  po::options_description desc("Allowed options");
  desc.add_options()
      ("help,h", "show help")
      ("output,o", po::value<std::string>(),
          "Output file. Leave empty to use stdout.")
      ("namespace,n", po::value<std::string>(),
          "Namespace to put the variables in.")
      ("input,i", po::value<std::vector<std::string>>(),
          "List of files to parse.");
  po::variables_map vm;

  try {
    po::store(po::parse_command_line(argc, argv, desc), vm);
    po::notify(vm);

    if (vm.count("help") || !vm.count("input")) {
      std::cout << desc << std::endl;
      return 1;
    }

    if (vm.count("output")) {
      auto filename = vm["output"].as<std::string>();
      open_file(filename, std::ios::out, [&vm](std::fstream& file) {
        render_header(file, vm);
      });
    } else {
      render_header(std::cout, vm);
    }
  } catch(std::exception& error) {
    std::cerr << error.what() << std::endl;
    return 1;
  }

  return 0;
}